

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O1

void DBaseDecal::SpreadRight(double r,side_t *feelwall,double wallsize,F3DFloor *ffloor)

{
  DVector2 *pDVar1;
  double dVar2;
  double dVar3;
  side_t *psVar4;
  long lVar5;
  DVector2 *pDVar6;
  uint uVar7;
  ulong uVar8;
  line_t_conflict *plVar9;
  long lVar10;
  side_t *feelwall_00;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  TArray<side_t_*,_side_t_*>::Grow(&SpreadStack,1);
  SpreadStack.Array[SpreadStack.Count] = feelwall;
  SpreadStack.Count = SpreadStack.Count + 1;
  if (wallsize < r) {
    do {
      uVar8 = (ulong)feelwall->RightSide;
      if (uVar8 == 0xffffffff) {
        return;
      }
      feelwall = sides + uVar8;
      psVar4 = (sides[uVar8].linedef)->sidedef[0];
      feelwall_00 = (sides[uVar8].linedef)->sidedef[1];
      if (psVar4 == feelwall) {
        if (feelwall_00 == (side_t *)0x0) goto LAB_004b5ad9;
      }
      else {
        bVar11 = feelwall_00 != feelwall;
        feelwall_00 = psVar4;
        if (bVar11) {
LAB_004b5ad9:
          feelwall_00 = (side_t *)0x0;
        }
      }
      if ((feelwall_00 != (side_t *)0x0) && (feelwall_00->LeftSide != 0xffffffff)) {
        uVar7 = (int)SpreadStack.Count >> 0x1f & SpreadStack.Count;
        lVar10 = (long)(int)SpreadStack.Count;
        do {
          if (lVar10 < 1) goto LAB_004b5b16;
          lVar5 = lVar10 + -1;
          lVar10 = lVar10 + -1;
        } while (SpreadStack.Array[lVar5] != feelwall_00);
        uVar7 = 1;
LAB_004b5b16:
        if (uVar7 == 0) {
          SpreadRight(r,feelwall_00,wallsize,ffloor);
        }
      }
      dVar12 = (wallsize + (DecalWidth - r)) - DecalLeft;
      plVar9 = feelwall->linedef;
      if (plVar9->sidedef[0] == feelwall) {
        dVar13 = (plVar9->delta).X;
        dVar14 = (plVar9->delta).Y;
      }
      else {
        pDVar1 = &plVar9->delta;
        pDVar6 = &plVar9->delta;
        plVar9 = (line_t_conflict *)&plVar9->v2;
        dVar13 = -pDVar1->X;
        dVar14 = -pDVar6->Y;
      }
      dVar2 = (plVar9->v1->p).X;
      dVar3 = (plVar9->v1->p).Y;
      wallsize = c_sqrt(dVar14 * dVar14 + dVar13 * dVar13);
      r = DecalRight - dVar12;
      (*(SpreadSource->super_DThinker).super_DObject._vptr_DObject[10])
                (dVar2 - (dVar13 * dVar12) / wallsize,dVar3 - (dVar14 * dVar12) / wallsize,SpreadZ,
                 SpreadSource,SpreadTemplate,feelwall,ffloor);
      TArray<side_t_*,_side_t_*>::Grow(&SpreadStack,1);
      SpreadStack.Array[SpreadStack.Count] = feelwall;
      SpreadStack.Count = SpreadStack.Count + 1;
    } while (wallsize < r);
  }
  return;
}

Assistant:

void DBaseDecal::SpreadRight (double r, side_t *feelwall, double wallsize, F3DFloor *ffloor)
{
	vertex_t *v1;
	double x, y, ldx, ldy;

	SpreadStack.Push (feelwall);

	while (r > wallsize && feelwall->RightSide != NO_SIDE)
	{
		feelwall = &sides[feelwall->RightSide];

		side_t *nextwall = NextWall (feelwall);
		if (nextwall != NULL && nextwall->LeftSide != NO_SIDE)
		{
			int i;

			for (i = SpreadStack.Size(); i-- > 0; )
			{
				if (SpreadStack[i] == nextwall)
					break;
			}
			if (i == -1)
			{
				SpreadRight (r, nextwall, wallsize, ffloor);
			}
		}

		r = DecalWidth - r + wallsize - DecalLeft;
		GetWallStuff (feelwall, v1, ldx, ldy);
		x = v1->fX();
		y = v1->fY();
		wallsize = Length (ldx, ldy);
		x -= r*ldx / wallsize;
		y -= r*ldy / wallsize;
		r = DecalRight - r;
		SpreadSource->CloneSelf (SpreadTemplate, x, y, SpreadZ, feelwall, ffloor);
		SpreadStack.Push (feelwall);
	}
}